

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_int>::sortMinUp
          (btAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,btDispatcher *dispatcher,
          bool updateOverlaps)

{
  Edge EVar1;
  Edge *pEVar2;
  uint uVar3;
  Handle *pHVar4;
  Handle *pHVar5;
  Handle *pHandleA;
  Handle *pHandleB;
  undefined8 in_RCX;
  uint in_EDX;
  int in_ESI;
  btAxisSweep3Internal<unsigned_int> *in_RDI;
  byte in_R8B;
  bool bVar6;
  Edge swap;
  int axis2;
  int axis1;
  Handle *handle1;
  Handle *handle0;
  Handle *pHandleNext;
  Handle *pHandleEdge;
  Edge *pNext;
  Edge *pEdge;
  Edge *local_30;
  Edge *local_28;
  
  local_28 = in_RDI->m_pEdges[in_ESI] + in_EDX;
  pHVar4 = getHandle(in_RDI,local_28->m_handle);
  pEVar2 = local_28;
  while( true ) {
    local_30 = pEVar2 + 1;
    bVar6 = false;
    if (pEVar2[1].m_handle != 0) {
      bVar6 = local_30->m_pos <= local_28->m_pos;
    }
    if (!bVar6) break;
    pHVar5 = getHandle(in_RDI,pEVar2[1].m_handle);
    uVar3 = Edge::IsMax(local_30);
    if (uVar3 == 0) {
      *(int *)((long)(&(pHVar5->super_btBroadphaseProxy).m_aabbMax + 1) + (long)in_ESI * 4) =
           *(int *)((long)(&(pHVar5->super_btBroadphaseProxy).m_aabbMax + 1) + (long)in_ESI * 4) +
           -1;
    }
    else {
      pHandleA = getHandle(in_RDI,local_28->m_handle);
      pHandleB = getHandle(in_RDI,pEVar2[1].m_handle);
      uVar3 = 1 << ((byte)in_ESI & 0x1f) & 3;
      if ((((in_R8B & 1) != 0) &&
          (bVar6 = testOverlap2D(in_RDI,pHandleA,pHandleB,uVar3,1 << (sbyte)uVar3 & 3), bVar6)) &&
         ((*(in_RDI->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [3])(in_RDI->m_pairCache,pHandleA,pHandleB,in_RCX),
         in_RDI->m_userPairCallback != (btOverlappingPairCallback *)0x0)) {
        (*in_RDI->m_userPairCallback->_vptr_btOverlappingPairCallback[3])
                  (in_RDI->m_userPairCallback,pHandleA,pHandleB,in_RCX);
      }
      pHVar5->m_maxEdges[in_ESI] = pHVar5->m_maxEdges[in_ESI] - 1;
    }
    *(int *)((long)(&(pHVar4->super_btBroadphaseProxy).m_aabbMax + 1) + (long)in_ESI * 4) =
         *(int *)((long)(&(pHVar4->super_btBroadphaseProxy).m_aabbMax + 1) + (long)in_ESI * 4) + 1;
    EVar1 = *local_28;
    *local_28 = *local_30;
    *local_30 = EVar1;
    local_28 = local_28 + 1;
    pEVar2 = local_30;
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		if (pNext->IsMax())
		{
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pNext->m_handle);
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;
			
			// if next edge is maximum remove any overlap between the two handles
			if (updateOverlaps 
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0,handle1,axis1,axis2)
#endif //USE_OVERLAP_TEST_ON_REMOVES
				)
			{
				

				m_pairCache->removeOverlappingPair(handle0,handle1,dispatcher);	
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0,handle1,dispatcher);
				
			}


			// update edge reference in other handle
			pHandleNext->m_maxEdges[axis]--;
		}
		else
			pHandleNext->m_minEdges[axis]--;

		pHandleEdge->m_minEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}